

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.h
# Opt level: O3

void __thiscall cmLinkImplItem::cmLinkImplItem(cmLinkImplItem *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Snapshot snapshot;
  cmCommandContext local_60;
  Snapshot local_38;
  
  (this->super_cmLinkItem).super_string._M_dataplus._M_p =
       (pointer)&(this->super_cmLinkItem).super_string.field_2;
  (this->super_cmLinkItem).super_string._M_string_length = 0;
  (this->super_cmLinkItem).super_string.field_2._M_local_buf[0] = '\0';
  (this->super_cmLinkItem).Target = (cmGeneratorTarget *)0x0;
  cmState::Snapshot::Snapshot(&local_38,(cmState *)0x0);
  paVar1 = &local_60.Name.field_2;
  local_60.Name._M_string_length = 0;
  local_60.Name.field_2._M_local_buf[0] = '\0';
  local_60.Line = 0;
  snapshot.Position.Tree = local_38.Position.Tree;
  snapshot.State = local_38.State;
  snapshot.Position.Position = local_38.Position.Position;
  local_60.Name._M_dataplus._M_p = (pointer)paVar1;
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,snapshot,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.Name._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.Name._M_dataplus._M_p,
                    CONCAT71(local_60.Name.field_2._M_allocated_capacity._1_7_,
                             local_60.Name.field_2._M_local_buf[0]) + 1);
  }
  this->FromGenex = false;
  return;
}

Assistant:

cmLinkImplItem(): cmLinkItem(), Backtrace(), FromGenex(false) {}